

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int GEO::compare_line(line *first,line *second)

{
  int iVar1;
  int iVar2;
  
  iVar2 = first->start;
  if (iVar2 == second->start) {
    iVar2 = first->end;
    iVar1 = 1;
  }
  else {
    iVar1 = 2;
  }
  if (iVar2 != second->end) {
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int GEO::compare_line(const line &first, const line &second)
{
    if (first.start==second.start)
    {
        if (first.end==second.end)
        {
            return 1;
        }
    }
    else if (first.start==second.end)
        return 2;
    return 3;
}